

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPFakeTransmitter::SendRTPData(RTPFakeTransmitter *this,void *data,size_t len)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  packet_ready_cb p_Var4;
  void *pvVar5;
  RTPIPv4Destination *pRVar6;
  size_t len_local;
  void *data_local;
  RTPFakeTransmitter *this_local;
  
  if ((this->init & 1U) == 0) {
    this_local._4_4_ = -0x84;
  }
  else if ((this->created & 1U) == 0) {
    this_local._4_4_ = -0x83;
  }
  else if (this->maxpacksize < len) {
    this_local._4_4_ = -0x86;
  }
  else {
    RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPFakeTrans_GetHashIndex_IPv4Dest,_8317>
    ::GotoFirstElement(&this->destinations);
    while( true ) {
      bVar1 = RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPFakeTrans_GetHashIndex_IPv4Dest,_8317>
              ::HasCurrentElement(&this->destinations);
      if (!bVar1) break;
      p_Var4 = RTPFakeTransmissionParams::GetPacketReadyCB(this->params);
      pvVar5 = RTPFakeTransmissionParams::GetPacketReadyCBData(this->params);
      pRVar6 = RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPFakeTrans_GetHashIndex_IPv4Dest,_8317>
               ::GetCurrentElement(&this->destinations);
      uVar3 = RTPIPv4Destination::GetIP_NBO(pRVar6);
      pRVar6 = RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPFakeTrans_GetHashIndex_IPv4Dest,_8317>
               ::GetCurrentElement(&this->destinations);
      uVar2 = RTPIPv4Destination::GetRTPPort_NBO(pRVar6);
      (*p_Var4)(pvVar5,(uint8_t *)data,(uint16_t)len,uVar3,uVar2,1);
      RTPHashTable<const_jrtplib::RTPIPv4Destination,_jrtplib::RTPFakeTrans_GetHashIndex_IPv4Dest,_8317>
      ::GotoNextElement(&this->destinations);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int RTPFakeTransmitter::SendRTPData(const void *data,size_t len)	
{
	if (!init)
		return ERR_RTP_FAKETRANS_NOTINIT;

	MAINMUTEX_LOCK
	
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_NOTCREATED;
	}
	if (len > maxpacksize)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_FAKETRANS_SPECIFIEDSIZETOOBIG;
	}


	destinations.GotoFirstElement();
    // send to each destination
	while (destinations.HasCurrentElement())
	{
        (*params->GetPacketReadyCB())(params->GetPacketReadyCBData(), (uint8_t*)data, len,
        destinations.GetCurrentElement().GetIP_NBO(),
        destinations.GetCurrentElement().GetRTPPort_NBO(),
        1);
		destinations.GotoNextElement();
	}
	
	MAINMUTEX_UNLOCK
	return 0;
}